

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long *plVar2;
  long lVar3;
  __int_type _Var4;
  __int_type _Var5;
  long *plVar6;
  write_guard wVar7;
  bool bVar8;
  ushort uVar9;
  int iVar10;
  ulong uVar11;
  pthread_t pVar12;
  void *extraout_RDX;
  long lVar13;
  optimistic_lock *poVar14;
  undefined7 in_register_00000031;
  ushort uVar15;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar16;
  write_guard local_70;
  write_guard child_guard_1;
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  __atomic_base<unsigned_long> local_48;
  write_guard node_guard_1;
  write_guard local_38;
  write_guard child_guard;
  
  uVar11 = CONCAT71(in_register_00000031,key_byte) & 0xffffffff;
  if ((inode->super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).children.
      _M_elems[uVar11].value._M_i.tagged_ptr == 0) {
    poVar14 = parent_critical_section->lock;
    _Var4 = (parent_critical_section->version).version;
    if ((poVar14->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_001621bb:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    _Var5 = (poVar14->version).version.super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar1 = &poVar14->read_lock_count;
    lVar13 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (_Var4 != _Var5) goto LAB_00162032;
    if (lVar13 < 1) goto LAB_001621da;
    parent_critical_section->lock = (optimistic_lock *)0x0;
    poVar14 = node_critical_section->lock;
    _Var4 = (node_critical_section->version).version;
    if ((poVar14->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001621bb;
    _Var5 = (poVar14->version).version.super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar1 = &poVar14->read_lock_count;
    lVar13 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (_Var4 == _Var5) {
      if (lVar13 < 1) goto LAB_001621da;
      node_critical_section->lock = (optimistic_lock *)0x0;
LAB_00161f24:
      uVar15 = 0x100;
      uVar9 = 0;
      goto LAB_00161f2b;
    }
    if (lVar13 < 1) goto LAB_001621da;
    node_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    piVar16 = (inode->super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).
              children._M_elems + uVar11;
    child->tagged_ptr = (piVar16->value)._M_i.tagged_ptr;
    node_guard_1.lock = (optimistic_lock *)node_critical_section;
    bVar8 = optimistic_lock::check
                      (node_critical_section->lock,
                       (version_type)(node_critical_section->version).version);
    if (bVar8) {
      child_guard_1.lock = &db_instance->root_pointer_lock;
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      child_critical_section->lock = (optimistic_lock *)local_60._M_i;
      local_60._M_i = 0;
      (child_critical_section->version).version = (version_tag_type)node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (child_critical_section->lock != (optimistic_lock *)0x0) {
        uVar11 = child->tagged_ptr;
        *child_type = (node_type)uVar11 & (I256|I48);
        if ((uVar11 & 7) == 0) {
          iVar10 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                             ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                              (uVar11 & 0xfffffffffffffff8),(void *)k.field_0,extraout_RDX);
          if (iVar10 == 0) {
            if ((inode->super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).
                super_basic_inode_256_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                .
                super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                .children_count.value.super___atomic_base<unsigned_char>._M_i != '1') {
              poVar14 = parent_critical_section->lock;
              _Var4 = (parent_critical_section->version).version;
              if ((poVar14->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001621bb;
              _Var5 = (poVar14->version).version.super___atomic_base<unsigned_long>._M_i;
              LOCK();
              paVar1 = &poVar14->read_lock_count;
              lVar13 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (_Var4 == _Var5) {
                if (lVar13 < 1) goto LAB_001621da;
                uVar15 = 0;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                  ((optimistic_lock *)
                                   ((node_guard_1.lock)->version).version.
                                   super___atomic_base<unsigned_long>._M_i,
                                   (version_type)
                                   ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>.
                                   _M_i);
                local_60._M_i = 0;
                if (bVar8) {
                  local_60._M_i =
                       ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>.
                       _M_i;
                }
                ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
                if (local_60._M_i != 0) {
                  bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                    (child_critical_section->lock,
                                     (version_type)(child_critical_section->version).version);
                  uVar15 = 0;
                  poVar14 = (optimistic_lock *)0x0;
                  if (bVar8) {
                    poVar14 = child_critical_section->lock;
                  }
                  child_critical_section->lock = (optimistic_lock *)0x0;
                  local_38.lock = poVar14;
                  if (poVar14 != (optimistic_lock *)0x0) {
                    optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                              (&poVar14->version);
                    pVar12 = pthread_self();
                    (poVar14->obsoleter_thread)._M_thread = pVar12;
                    local_38.lock = (optimistic_lock *)0x0;
                    olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::remove(inode,(char *)(ulong)key_byte);
                    *child_in_parent =
                         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                          *)0x0;
                    uVar15 = 0x100;
                  }
                  optimistic_lock::write_guard::~write_guard(&local_38);
                }
                optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
                goto LAB_00161dc4;
              }
              goto LAB_00162032;
            }
            basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
            ::
            make_db_inode_unique_ptr<unodb::detail::olc_inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
                      ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                        *)&stack0xffffffffffffffa0,(db_type *)child_guard_1.lock,inode);
            bVar8 = optimistic_lock::try_upgrade_to_write_lock
                              (parent_critical_section->lock,
                               (version_type)(parent_critical_section->version).version);
            wVar7 = node_guard_1;
            local_38.lock = (optimistic_lock *)0x0;
            if (bVar8) {
              local_38.lock = parent_critical_section->lock;
            }
            parent_critical_section->lock = (optimistic_lock *)0x0;
            if (local_38.lock != (optimistic_lock *)0x0) {
              bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                ((optimistic_lock *)
                                 ((node_guard_1.lock)->version).version.
                                 super___atomic_base<unsigned_long>._M_i,
                                 (version_type)
                                 ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>.
                                 _M_i);
              local_48._M_i = 0;
              if (bVar8) {
                local_48._M_i =
                     ((wVar7.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
              }
              ((wVar7.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              if (local_48._M_i != 0) {
                bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                  (child_critical_section->lock,
                                   (version_type)(child_critical_section->version).version);
                local_70.lock = (optimistic_lock *)0x0;
                if (bVar8) {
                  local_70.lock = child_critical_section->lock;
                }
                child_critical_section->lock = (optimistic_lock *)0x0;
                if (local_70.lock != (optimistic_lock *)0x0) {
                  olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                  init((olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)node_guard.lock,(EVP_PKEY_CTX *)child_guard_1.lock);
                  wVar7 = node_guard;
                  node_guard.lock = (optimistic_lock *)0x0;
                  if (((ulong)wVar7.lock & 7) != 0) {
                    __assert_fail("(result & ptr_bit_mask) == uintptr",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                  ,0x182,
                                  "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                                 );
                  }
                  (node_in_parent->value)._M_i.tagged_ptr = (ulong)wVar7.lock | 3;
                  if (local_48._M_i != 0) {
                    __assert_fail("!node_guard.active()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x644,
                                  "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_256<unsigned long, std::span<const std::byte>>]"
                                 );
                  }
                  if (local_70.lock != (optimistic_lock *)0x0) {
                    __assert_fail("!child_guard.active()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x645,
                                  "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_256<unsigned long, std::span<const std::byte>>]"
                                 );
                  }
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  optimistic_lock::write_guard::~write_guard(&local_70);
                  optimistic_lock::write_guard::~write_guard((write_guard *)&local_48);
                  optimistic_lock::write_guard::~write_guard(&local_38);
                  std::
                  unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 *)&stack0xffffffffffffffa0);
                  LOCK();
                  child_guard_1.lock[0x1b].obsoleter_thread._M_thread =
                       child_guard_1.lock[0x1b].obsoleter_thread._M_thread + 1;
                  UNLOCK();
                  goto LAB_00161dbf;
                }
                optimistic_lock::write_guard::~write_guard(&local_70);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&local_48);
            }
            optimistic_lock::write_guard::~write_guard(&local_38);
            std::
            unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)&stack0xffffffffffffffa0);
          }
          else {
            poVar14 = parent_critical_section->lock;
            _Var4 = (parent_critical_section->version).version;
            if ((poVar14->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001621bb;
            _Var5 = (poVar14->version).version.super___atomic_base<unsigned_long>._M_i;
            LOCK();
            paVar1 = &poVar14->read_lock_count;
            lVar13 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (_Var4 != _Var5) goto LAB_00162032;
            if (lVar13 < 1) goto LAB_001621da;
            parent_critical_section->lock = (optimistic_lock *)0x0;
            plVar6 = (long *)((node_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar13 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar6[1] < 1) goto LAB_001621bb;
            LOCK();
            plVar2 = plVar6 + 1;
            lVar3 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (lVar13 == *plVar6) {
              if (lVar3 < 1) goto LAB_001621da;
              ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              poVar14 = child_critical_section->lock;
              _Var4 = (child_critical_section->version).version;
              if ((poVar14->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001621bb;
              _Var5 = (poVar14->version).version.super___atomic_base<unsigned_long>._M_i;
              LOCK();
              paVar1 = &poVar14->read_lock_count;
              lVar13 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (_Var4 == _Var5) {
                if (lVar13 < 1) goto LAB_001621da;
                child_critical_section->lock = (optimistic_lock *)0x0;
                goto LAB_00161f24;
              }
              if (lVar13 < 1) goto LAB_001621da;
              child_critical_section->lock = (optimistic_lock *)0x0;
            }
            else {
              if (lVar3 < 1) goto LAB_001621da;
              ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
            }
          }
        }
        else {
          *child_in_parent = piVar16;
          poVar14 = parent_critical_section->lock;
          _Var4 = (parent_critical_section->version).version;
          if ((poVar14->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001621bb;
          _Var5 = (poVar14->version).version.super___atomic_base<unsigned_long>._M_i;
          LOCK();
          paVar1 = &poVar14->read_lock_count;
          lVar13 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (_Var4 == _Var5) {
            if (lVar13 < 1) goto LAB_001621da;
            parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_00161dbf:
            uVar15 = 0x100;
LAB_00161dc4:
            uVar9 = 1;
            goto LAB_00161f2b;
          }
LAB_00162032:
          if (lVar13 < 1) {
LAB_001621da:
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
          parent_critical_section->lock = (optimistic_lock *)0x0;
        }
      }
    }
    else {
      ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
  uVar9 = 0;
  uVar15 = 0;
LAB_00161f2b:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar15 | uVar9);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}